

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsFieldDescriptorSetFixedOrder
              (FmsFieldDescriptor fd,FmsFieldType field_type,FmsBasisType basis_type,FmsInt order)

{
  ulong uVar1;
  FmsComponent pFVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  _FmsFieldDescriptor_FixedOrder *p_Var8;
  FmsInt *pFVar9;
  long *plVar10;
  FmsInt FVar11;
  long lVar12;
  FmsInt FVar13;
  long lVar14;
  undefined1 local_68 [16];
  ulong local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if (fd == (FmsFieldDescriptor)0x0) {
    iVar7 = 1;
  }
  else {
    pFVar2 = fd->component;
    if (pFVar2 == (FmsComponent)0x0) {
      iVar7 = 2;
    }
    else {
      iVar7 = 3;
      if ((fd->descriptor).any == (void *)0x0) {
        if (field_type < (FMS_HDIV|FMS_DISCONTINUOUS)) {
          uVar3 = pFVar2->dim;
          switch(field_type) {
          case FMS_CONTINUOUS:
            if (order == 0) {
              return 4;
            }
            local_68._8_8_ = order - 1;
            local_68._0_8_ = 1;
            local_58 = (order - 2) * local_68._8_8_ >> 1;
            local_50 = local_68._8_8_ * local_68._8_8_;
            local_48._8_8_ = local_68._8_8_ * local_68._8_8_ * local_68._8_8_;
            local_48._0_8_ = ((order - 3) * local_58) / 3;
            local_38._8_8_ = ((order * 2 + -3) * local_58) / 3;
            local_38._0_8_ = local_68._8_8_ * local_58;
            break;
          default:
            local_68._8_8_ = order + 1;
            local_68._0_8_ = 1;
            local_58 = (order + 2) * local_68._8_8_ >> 1;
            local_50 = local_68._8_8_ * local_68._8_8_;
            local_48._8_8_ = local_68._8_8_ * local_68._8_8_ * local_68._8_8_;
            local_48._0_8_ = ((order + 3) * local_58) / 3;
            local_38._8_8_ = ((order * 2 + 3) * local_58) / 3;
            local_38._0_8_ = local_68._8_8_ * local_58;
            lVar12 = 0;
            do {
              if (*(ulong *)((long)FmsEntityDim + lVar12) < uVar3) {
                *(undefined8 *)(local_68 + lVar12) = 0;
              }
              lVar12 = lVar12 + 8;
            } while (lVar12 != 0x40);
            break;
          case FMS_HCURL:
            FmsFieldDescriptorSetFixedOrder_cold_1();
          case FMS_HDIV:
            uVar1 = order + 1;
            local_68 = (undefined1  [16])0x0;
            local_48 = (undefined1  [16])0x0;
            if (uVar3 == 2) {
              plVar10 = &local_50;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uVar1;
              local_68 = auVar6 << 0x40;
              local_58 = uVar1 * order;
              lVar12 = order * 2;
            }
            else {
              plVar10 = (long *)(local_48 + 8);
              local_58 = uVar1 * (order + 2) >> 1;
              local_50 = uVar1 * uVar1;
              local_48._8_8_ = 0;
              local_48._0_8_ = (order + 2) * uVar1 * order >> 1;
              lVar12 = uVar1 * order * 3;
            }
            *plVar10 = lVar12 * uVar1;
            local_38 = (undefined1  [16])0x0;
          }
          if (pFVar2->num_parts == 0) {
            FVar13 = 0;
          }
          else {
            pFVar9 = pFVar2->parts->num_entities;
            FVar11 = 0;
            FVar13 = 0;
            do {
              lVar14 = 0;
              lVar12 = 0;
              do {
                uVar3 = pFVar9[lVar12];
                uVar1 = (pFVar9 + lVar12)[1];
                uVar4 = *(ulong *)(local_68 + lVar12 * 8);
                uVar5 = *(ulong *)(local_68 + lVar12 * 8 + 8);
                FVar13 = FVar13 + (uVar4 & 0xffffffff) * (uVar3 & 0xffffffff) +
                         ((uVar3 >> 0x20) * (uVar4 & 0xffffffff) +
                          (uVar4 >> 0x20) * (uVar3 & 0xffffffff) << 0x20);
                lVar14 = lVar14 + (uVar5 & 0xffffffff) * (uVar1 & 0xffffffff) +
                         ((uVar1 >> 0x20) * (uVar5 & 0xffffffff) +
                          (uVar5 >> 0x20) * (uVar1 & 0xffffffff) << 0x20);
                lVar12 = lVar12 + 2;
              } while (lVar12 != 8);
              FVar13 = lVar14 + FVar13;
              FVar11 = FVar11 + 1;
              pFVar9 = pFVar9 + 0x1d;
            } while (FVar11 != pFVar2->num_parts);
          }
          p_Var8 = (_FmsFieldDescriptor_FixedOrder *)malloc(0x10);
          if (p_Var8 == (_FmsFieldDescriptor_FixedOrder *)0x0) {
            iVar7 = 6;
          }
          else {
            p_Var8->field_type = field_type;
            p_Var8->basis_type = basis_type;
            p_Var8->order = order;
            fd->descr_type = FMS_FIXED_ORDER;
            (fd->descriptor).fixed_order = p_Var8;
            fd->num_dofs = FVar13;
            iVar7 = 0;
          }
        }
        else {
          iVar7 = 5;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int FmsFieldDescriptorSetFixedOrder(FmsFieldDescriptor fd,
                                    FmsFieldType field_type,
                                    FmsBasisType basis_type, FmsInt order) {
  if (!fd) { E_RETURN(1); }
  FmsComponent comp = fd->component;
  if (!comp) { E_RETURN(2); }
  if (fd->descriptor.any != NULL) { E_RETURN(3); }
  FmsInt num_dofs = 0;
  // Count the number of dofs - based on component, field_type and order
  FmsInt ent_dofs[FMS_NUM_ENTITY_TYPES];
  const FmsInt dim = comp->dim;
  const FmsInt p = order;
  switch (field_type) {
  case FMS_CONTINUOUS: {
    const FmsInt pm1 = p-1, pm2 = p-2, pm3 = p-3;
    if (p <= 0) { E_RETURN(4); }
    ent_dofs[FMS_VERTEX] = 1;
    ent_dofs[FMS_EDGE] = pm1;
    ent_dofs[FMS_TRIANGLE] = (pm1*pm2)/2;
    ent_dofs[FMS_QUADRILATERAL] = pm1*pm1;
    ent_dofs[FMS_TETRAHEDRON] = (ent_dofs[FMS_TRIANGLE]*pm3)/3;
    ent_dofs[FMS_HEXAHEDRON] = ent_dofs[FMS_QUADRILATERAL]*pm1;
    ent_dofs[FMS_WEDGE] = ent_dofs[FMS_TRIANGLE]*pm1;
    ent_dofs[FMS_PYRAMID] = (ent_dofs[FMS_TRIANGLE]*(p+pm3))/3;
    break;
  }
  case FMS_DISCONTINUOUS:
  case FMS_DISCONTINUOUS_WEIGHTED: {
    const FmsInt pp1 = p+1, pp2 = p+2, pp3 = p+3;
    // if (p < 0) { E_RETURN(4); } // If we make FmsInt a signed type
    ent_dofs[FMS_VERTEX] = 1;
    ent_dofs[FMS_EDGE] = pp1;
    ent_dofs[FMS_TRIANGLE] = (pp1*pp2)/2;
    ent_dofs[FMS_QUADRILATERAL] = pp1*pp1;
    ent_dofs[FMS_TETRAHEDRON] = (ent_dofs[FMS_TRIANGLE]*pp3)/3;
    ent_dofs[FMS_HEXAHEDRON] = ent_dofs[FMS_QUADRILATERAL]*pp1;
    ent_dofs[FMS_WEDGE] = ent_dofs[FMS_TRIANGLE]*pp1;
    ent_dofs[FMS_PYRAMID] = (ent_dofs[FMS_TRIANGLE]*(p+pp3))/3;
    for (FmsInt et = 0; et < FMS_NUM_ENTITY_TYPES; et++) {
      if (FmsEntityDim[et] < dim) {
        ent_dofs[et] = 0;
      }
    }
    break;
  }
  case FMS_HCURL: {
    FmsAbortNotImplemented();
    break;
  }
  case FMS_HDIV: {
    const FmsInt pp1 = p + 1, pp2 = p + 2;
    ent_dofs[FMS_VERTEX] = 0;
    ent_dofs[FMS_EDGE] = 0;
    ent_dofs[FMS_TETRAHEDRON] = 0;
    ent_dofs[FMS_HEXAHEDRON] = 0;
    if(dim == 2) {
      ent_dofs[FMS_EDGE] = pp1;
      ent_dofs[FMS_TRIANGLE] = p*pp1;
      ent_dofs[FMS_QUADRILATERAL] = 2*p*pp1;
    } else {
      ent_dofs[FMS_TRIANGLE] = pp1*pp2/2;
      ent_dofs[FMS_QUADRILATERAL] = pp1*pp1;
      ent_dofs[FMS_TETRAHEDRON] = p*pp1*(p + 2)/2;
      ent_dofs[FMS_HEXAHEDRON] = 3*p*pp1*pp1;
    }
    ent_dofs[FMS_WEDGE] = 0;
    ent_dofs[FMS_PYRAMID] = 0;
    break;
  }
  default: E_RETURN(5);
  }
  // Count the dofs part by part
  for (FmsInt i = 0; i < comp->num_parts; i++) {
    for (FmsInt et = 0; et < FMS_NUM_ENTITY_TYPES; et++) {
      num_dofs += comp->parts[i].num_entities[et] * ent_dofs[et];
    }
  }

  // Construct fixed-order descriptor
  struct _FmsFieldDescriptor_FixedOrder *fo;
  fo = malloc(sizeof(*fo));
  if (fo == NULL) { E_RETURN(6); }
  fo->field_type = field_type;
  fo->basis_type = basis_type;
  fo->order = order;
  // Update fd
  fd->descr_type = FMS_FIXED_ORDER;
  fd->descriptor.fixed_order = fo;
  fd->num_dofs = num_dofs;
  return 0;
}